

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void SubVerifyBase<unsigned_char,short>(char *types)

{
  bool bVar1;
  TestCase<unsigned_char,_short,_4> TVar2;
  char *pcVar3;
  string msg_2;
  uchar x;
  string msg_1;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  uchar ret;
  TestCase<unsigned_char,_short,_4> test;
  TestVector<unsigned_char,_short,_4> tests;
  undefined6 in_stack_fffffffffffffdd8;
  short in_stack_fffffffffffffdde;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffde0;
  TestVector<unsigned_char,_short,_4> *in_stack_fffffffffffffde8;
  allocator *in_stack_fffffffffffffdf0;
  undefined1 local_1c1 [28];
  undefined1 in_stack_fffffffffffffe5b;
  short in_stack_fffffffffffffe5c;
  uchar in_stack_fffffffffffffe5f;
  string *in_stack_fffffffffffffe60;
  string local_198 [32];
  string local_178 [32];
  string local_158 [36];
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_134;
  uchar local_132;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [37];
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [34];
  undefined4 local_26;
  byte local_22;
  TestVector<unsigned_char,_short,_4> local_20;
  
  TestVector<unsigned_char,_short,_4>::TestVector(&local_20);
  TVar2 = TestVector<unsigned_char,_short,_4>::GetNext(in_stack_fffffffffffffde8);
  local_26 = TVar2._0_4_;
  local_22 = TVar2.fExpected;
  while( true ) {
    bVar1 = TestVector<unsigned_char,_short,_4>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeSubtract<unsigned_char,short>
                      ((uchar)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                       (short)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                       (uchar *)CONCAT26(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8));
    if (bVar1 != (bool)(local_22 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,"Error in case ",&local_69);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,pcVar3,&local_a1);
      err_msg<unsigned_char,short>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f,in_stack_fffffffffffffe5c,
                 (bool)in_stack_fffffffffffffe5b);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_48);
    }
    local_a2 = 1;
    SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(&local_a3,(uchar *)&local_26);
    SafeInt<unsigned_char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator-=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdde);
    if ((local_a2 & 1) != (local_22 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Error in case ",&local_109);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,pcVar3,&local_131);
      err_msg<unsigned_char,short>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f,in_stack_fffffffffffffe5c,
                 (bool)in_stack_fffffffffffffe5b);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      std::__cxx11::string::~string(local_c8);
    }
    local_a2 = 1;
    local_132 = (uchar)local_26;
    SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_134,(short *)((long)&local_26 + 2));
    operator-=((uchar *)in_stack_fffffffffffffde8,
               (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(short)((ulong)in_stack_fffffffffffffdf0 >> 0x30));
    if ((local_a2 & 1) != (local_22 & 1)) {
      in_stack_fffffffffffffdf0 = (allocator *)&stack0xfffffffffffffe67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_198,"Error in case ",in_stack_fffffffffffffdf0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
      in_stack_fffffffffffffde0 =
           (SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffde8 = (TestVector<unsigned_char,_short,_4> *)local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1c1 + 1),(char *)in_stack_fffffffffffffde0,
                 (allocator *)in_stack_fffffffffffffde8);
      err_msg<unsigned_char,short>
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5f,in_stack_fffffffffffffe5c,
                 (bool)in_stack_fffffffffffffe5b);
      std::__cxx11::string::~string((string *)(local_1c1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1c1);
      std::__cxx11::string::~string(local_158);
    }
    TVar2 = TestVector<unsigned_char,_short,_4>::GetNext(in_stack_fffffffffffffde8);
    local_26 = TVar2._0_4_;
    local_22 = TVar2.fExpected;
  }
  return;
}

Assistant:

void SubVerifyBase(const char* types)
{
    TestVector< T, U, OpType::Sub > tests;
    TestCase< T, U, OpType::Sub > test = tests.GetNext();

    while (!tests.Done())
    {
        T ret;
        if (SafeSubtract(test.x, test.y, ret) != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types;
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Now test throwing version
        bool fSuccess = true;
        try
        {
            SafeInt<T> si(test.x);
            si -= test.y;
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (1): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        // Also need to test the version that assigns back out
        // to a plain int, as it has different logic
        fSuccess = true;
        try
        {
            T x(test.x);
            x -= SafeInt<U>(test.y);
        }
        catch (...)
        {
            fSuccess = false;
        }

        if (fSuccess != test.fExpected)
        {
            std::string msg = std::string("Error in case ") + types + " throw (2): ";
            err_msg(msg.c_str(), test.x, test.y, test.fExpected);
        }

        test = tests.GetNext();
    }
}